

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O0

int CfdAddTransactionInput
              (void *handle,void *create_handle,char *txid,uint32_t vout,uint32_t sequence)

{
  ConfidentialTransaction *this;
  bool bVar1;
  undefined8 uVar2;
  uint32_t in_ECX;
  char *in_RDX;
  long in_RSI;
  uint32_t in_R8D;
  CfdException *except;
  exception *std_except;
  ConfidentialTransactionContext *tx_1;
  TransactionContext *tx;
  bool is_bitcoin;
  CfdCapiTransactionData *tx_data;
  string *in_stack_fffffffffffffe20;
  undefined8 in_stack_fffffffffffffe28;
  CfdError error_code;
  allocator *paVar3;
  CfdException *in_stack_fffffffffffffe30;
  Transaction *this_00;
  undefined7 in_stack_fffffffffffffe68;
  long lVar4;
  int network_type;
  allocator local_169;
  string local_168;
  Txid local_148;
  ConfidentialTransaction *local_128;
  allocator local_119;
  string local_118;
  string *in_stack_ffffffffffffff18;
  pointer in_stack_ffffffffffffff20;
  allocator local_c9;
  string local_c8 [37];
  byte local_a3;
  undefined1 local_a2;
  allocator local_a1;
  string local_a0 [32];
  CfdSourceLocation local_80;
  long local_68;
  allocator local_59;
  string local_58 [48];
  uint32_t local_28;
  uint32_t local_24;
  char *local_20;
  long local_18;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffe28 >> 0x20);
  local_28 = in_R8D;
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  lVar4 = local_18;
  std::allocator<char>::allocator();
  network_type = (int)((ulong)lVar4 >> 0x20);
  std::__cxx11::string::string(local_58,"TransactionData",&local_59);
  cfd::capi::CheckBuffer(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  local_68 = local_18;
  bVar1 = cfd::capi::IsEmptyString(local_20);
  if (bVar1) {
    local_80.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
                 ,0x2f);
    local_80.filename = local_80.filename + 1;
    local_80.line = 0x12f;
    local_80.funcname = "CfdAddTransactionInput";
    cfd::core::logger::warn<>(&local_80,"txid is null or empty.");
    local_a2 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"Failed to parameter. txid is null or empty.",&local_a1);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffe30,error_code,in_stack_fffffffffffffe20);
    local_a2 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_a3 = 0;
  cfd::capi::ConvertNetType(network_type,(bool *)CONCAT17(bVar1,in_stack_fffffffffffffe68));
  if (*(long *)(local_68 + 0x18) == 0) {
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"Invalid handle state. tx is null",&local_c9);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffe30,error_code,in_stack_fffffffffffffe20);
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if ((local_a3 & 1) == 0) {
    this = *(ConfidentialTransaction **)(local_68 + 0x18);
    paVar3 = &local_169;
    local_128 = this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_168,local_20,paVar3);
    cfd::core::Txid::Txid(&local_148,&local_168);
    cfd::core::ConfidentialTransaction::AddTxIn
              (this,&local_148,local_24,local_28,(Script *)cfd::core::Script::Empty);
    cfd::core::Txid::~Txid((Txid *)0x606f47);
    std::__cxx11::string::~string((string *)&local_168);
    std::allocator<char>::~allocator((allocator<char> *)&local_169);
  }
  else {
    this_00 = *(Transaction **)(local_68 + 0x18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_118,local_20,&local_119);
    cfd::core::Txid::Txid((Txid *)&stack0xffffffffffffff08,&local_118);
    cfd::core::Transaction::AddTxIn
              (this_00,(Txid *)&stack0xffffffffffffff08,local_24,local_28,
               (Script *)cfd::core::Script::Empty);
    cfd::core::Txid::~Txid((Txid *)0x606e16);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator((allocator<char> *)&local_119);
  }
  return 0;
}

Assistant:

int CfdAddTransactionInput(
    void* handle, void* create_handle, const char* txid, uint32_t vout,
    uint32_t sequence) {
  try {
    cfd::Initialize();
    CheckBuffer(create_handle, kPrefixTransactionData);
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(create_handle);
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }

    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      TransactionContext* tx =
          static_cast<TransactionContext*>(tx_data->tx_obj);
      tx->AddTxIn(Txid(std::string(txid)), vout, sequence);
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext* tx =
          static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
      tx->AddTxIn(Txid(std::string(txid)), vout, sequence);
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}